

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O3

void __thiscall dumper::dumpkeys(dumper *this,uint32_t id,string *path)

{
  size_type *psVar1;
  uint uVar2;
  pointer pcVar3;
  key *pkVar4;
  undefined8 *puVar5;
  ulong uVar6;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  string local_50;
  
  if (id != 0) {
    do {
      pkVar4 = getkey(this,id);
      (*this->_vptr_dumper[3])(this,pkVar4,path);
      dumpvalues(this,pkVar4->_firstvalue & 0xfffffff);
      uVar2 = pkVar4->_firstchild;
      local_90 = local_80;
      pcVar3 = (path->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar3,pcVar3 + path->_M_string_length);
      std::__cxx11::string::append((char *)&local_90);
      local_70 = local_60;
      pcVar3 = (pkVar4->_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + (pkVar4->_name)._M_string_length);
      uVar6 = 0xf;
      if (local_90 != local_80) {
        uVar6 = local_80[0];
      }
      if (uVar6 < (ulong)(local_68 + local_88)) {
        uVar6 = 0xf;
        if (local_70 != local_60) {
          uVar6 = local_60[0];
        }
        if (uVar6 < (ulong)(local_68 + local_88)) goto LAB_00115e2c;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
      }
      else {
LAB_00115e2c:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
      }
      psVar1 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_50.field_2._M_allocated_capacity = *psVar1;
        local_50.field_2._8_8_ = puVar5[3];
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50.field_2._M_allocated_capacity = *psVar1;
        local_50._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_50._M_string_length = puVar5[1];
      *puVar5 = psVar1;
      puVar5[1] = 0;
      *(undefined1 *)psVar1 = 0;
      dumpkeys(this,uVar2 & 0xfffffff,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      id = pkVar4->_nextsibling & 0xfffffff;
    } while (id != 0);
  }
  return;
}

Assistant:

void dumpkeys(uint32_t id, const std::string& path)
    {
        while (id)
        {
            ent::key *k= getkey(id);
            dumpkey(k, path);
            dumpvalues(k->firstvalue());
            dumpkeys(k->firstchild(), path+"\\"+k->name());
            id= k->nextsibling();
        }
    }